

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

void coda_XmlPrologStateInit(PROLOG_STATE *state)

{
  state->handler = prolog0;
  state->includeLevel = 0;
  state->documentEntity = 1;
  state->inEntityValue = 0;
  return;
}

Assistant:

void
XmlPrologStateInit(PROLOG_STATE *state) {
  state->handler = prolog0;
#ifdef XML_DTD
  state->documentEntity = 1;
  state->includeLevel = 0;
  state->inEntityValue = 0;
#endif /* XML_DTD */
}